

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateCaseEnum
          (OneofGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  mapped_type *pmVar2;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *extraout_RDX_00;
  long lVar3;
  long lVar4;
  string enum_name;
  AlphaNum local_a0;
  string field_name;
  string local_50;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"typedef GPB_ENUM($enum_name$) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,"$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::__cxx11::string::string((string *)&local_a0,"enum_name",(allocator *)&field_name);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_a0);
  std::__cxx11::string::string((string *)&enum_name,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  lVar3 = 0;
  field = extraout_RDX;
  for (lVar4 = 0; lVar4 < *(int *)(this->descriptor_ + 4); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(this->descriptor_ + 0x20);
    FieldNameCapitalized_abi_cxx11_(&field_name,(objectivec *)(lVar1 + lVar3),field);
    strings::AlphaNum::AlphaNum(&local_a0,*(int *)(lVar1 + 4 + lVar3));
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_a0,a);
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
              (printer,"$enum_name$_$field_name$ = $field_number$,\n",(char (*) [10])"enum_name",
               &enum_name,(char (*) [11])0x3f313c,&field_name,(char (*) [13])"field_number",
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&field_name);
    lVar3 = lVar3 + 0x48;
    field = extraout_RDX_00;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"};\n\n");
  std::__cxx11::string::~string((string *)&enum_name);
  return;
}

Assistant:

void OneofGenerator::GenerateCaseEnum(io::Printer* printer) {
  printer->Print(
      variables_,
      "typedef GPB_ENUM($enum_name$) {\n");
  printer->Indent();
  printer->Print(
      variables_,
      "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::string enum_name = variables_["enum_name"];
  for (int j = 0; j < descriptor_->field_count(); j++) {
    const FieldDescriptor* field = descriptor_->field(j);
    std::string field_name = FieldNameCapitalized(field);
    printer->Print(
        "$enum_name$_$field_name$ = $field_number$,\n",
        "enum_name", enum_name,
        "field_name", field_name,
        "field_number", StrCat(field->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");
}